

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::AggregationPS::AggregationPS(AggregationPS *this,AggregationPS *old)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int32_t iVar7;
  
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006a2340;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar4 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar4;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__AggregationPS_006a2608;
  iVar4 = old->m_i;
  iVar5 = old->m_old_j;
  iVar6 = old->m_old_i;
  this->m_j = old->m_j;
  this->m_i = iVar4;
  this->m_old_j = iVar5;
  this->m_old_i = iVar6;
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_upper).m_backend.data._M_elems + 8);
  uVar1 = *(undefined8 *)(old->m_upper).m_backend.data._M_elems;
  uVar2 = *(undefined8 *)((old->m_upper).m_backend.data._M_elems + 2);
  uVar3 = *(undefined8 *)((old->m_upper).m_backend.data._M_elems + 6);
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 4) =
       *(undefined8 *)((old->m_upper).m_backend.data._M_elems + 4);
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)(this->m_upper).m_backend.data._M_elems = uVar1;
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 2) = uVar2;
  (this->m_upper).m_backend.exp = (old->m_upper).m_backend.exp;
  (this->m_upper).m_backend.neg = (old->m_upper).m_backend.neg;
  iVar7 = (old->m_upper).m_backend.prec_elem;
  (this->m_upper).m_backend.fpclass = (old->m_upper).m_backend.fpclass;
  (this->m_upper).m_backend.prec_elem = iVar7;
  uVar1 = *(undefined8 *)((old->m_lower).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_lower).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_lower).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_lower).m_backend.data._M_elems =
       *(undefined8 *)(old->m_lower).m_backend.data._M_elems;
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_lower).m_backend.data._M_elems + 8);
  (this->m_lower).m_backend.exp = (old->m_lower).m_backend.exp;
  (this->m_lower).m_backend.neg = (old->m_lower).m_backend.neg;
  iVar7 = (old->m_lower).m_backend.prec_elem;
  (this->m_lower).m_backend.fpclass = (old->m_lower).m_backend.fpclass;
  (this->m_lower).m_backend.prec_elem = iVar7;
  uVar1 = *(undefined8 *)((old->m_obj).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_obj).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_obj).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_obj).m_backend.data._M_elems =
       *(undefined8 *)(old->m_obj).m_backend.data._M_elems;
  *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_obj).m_backend.data._M_elems + 8);
  (this->m_obj).m_backend.exp = (old->m_obj).m_backend.exp;
  (this->m_obj).m_backend.neg = (old->m_obj).m_backend.neg;
  iVar7 = (old->m_obj).m_backend.prec_elem;
  (this->m_obj).m_backend.fpclass = (old->m_obj).m_backend.fpclass;
  (this->m_obj).m_backend.prec_elem = iVar7;
  uVar1 = *(undefined8 *)((old->m_oldupper).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_oldupper).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_oldupper).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_oldupper).m_backend.data._M_elems =
       *(undefined8 *)(old->m_oldupper).m_backend.data._M_elems;
  *(undefined8 *)((this->m_oldupper).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_oldupper).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_oldupper).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_oldupper).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_oldupper).m_backend.data._M_elems + 8);
  (this->m_oldupper).m_backend.exp = (old->m_oldupper).m_backend.exp;
  (this->m_oldupper).m_backend.neg = (old->m_oldupper).m_backend.neg;
  iVar7 = (old->m_oldupper).m_backend.prec_elem;
  (this->m_oldupper).m_backend.fpclass = (old->m_oldupper).m_backend.fpclass;
  (this->m_oldupper).m_backend.prec_elem = iVar7;
  uVar1 = *(undefined8 *)((old->m_oldlower).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_oldlower).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_oldlower).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_oldlower).m_backend.data._M_elems =
       *(undefined8 *)(old->m_oldlower).m_backend.data._M_elems;
  *(undefined8 *)((this->m_oldlower).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_oldlower).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_oldlower).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_oldlower).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_oldlower).m_backend.data._M_elems + 8);
  (this->m_oldlower).m_backend.exp = (old->m_oldlower).m_backend.exp;
  (this->m_oldlower).m_backend.neg = (old->m_oldlower).m_backend.neg;
  iVar7 = (old->m_oldlower).m_backend.prec_elem;
  (this->m_oldlower).m_backend.fpclass = (old->m_oldlower).m_backend.fpclass;
  (this->m_oldlower).m_backend.prec_elem = iVar7;
  uVar1 = *(undefined8 *)((old->m_rhs).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_rhs).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_rhs).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_rhs).m_backend.data._M_elems =
       *(undefined8 *)(old->m_rhs).m_backend.data._M_elems;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_rhs).m_backend.data._M_elems + 8);
  (this->m_rhs).m_backend.exp = (old->m_rhs).m_backend.exp;
  (this->m_rhs).m_backend.neg = (old->m_rhs).m_backend.neg;
  iVar7 = (old->m_rhs).m_backend.prec_elem;
  (this->m_rhs).m_backend.fpclass = (old->m_rhs).m_backend.fpclass;
  (this->m_rhs).m_backend.prec_elem = iVar7;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_row)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a0f40;
  (this->m_row).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_row,
             (old->m_row).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&(old->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_col)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a0f40;
  (this->m_col).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_col,
             (old->m_col).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&(old->m_col).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  return;
}

Assistant:

AggregationPS(const AggregationPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_i(old.m_i)
         , m_old_j(old.m_old_j)
         , m_old_i(old.m_old_i)
         , m_upper(old.m_upper)
         , m_lower(old.m_lower)
         , m_obj(old.m_obj)
         , m_oldupper(old.m_oldupper)
         , m_oldlower(old.m_oldlower)
         , m_rhs(old.m_rhs)
         , m_row(old.m_row)
         , m_col(old.m_col)
      {}